

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

DistributionMapping
amrex::DistributionMapping::makeKnapSack(Vector<double,_std::allocator<double>_> *rcost,int nmax)

{
  DistributionMapping *this;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> efficiency;
  reference pdVar1;
  long lVar2;
  Long LVar3;
  double *pdVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *in_RDI;
  literals *this_00;
  longdouble lVar7;
  Real RVar8;
  DistributionMapping DVar9;
  Real eff;
  int nprocs;
  int i;
  Real scale;
  Real wmax;
  Vector<long,_std::allocator<long>_> cost;
  DistributionMapping *r;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 uVar11;
  undefined2 in_stack_ffffffffffffff20;
  undefined2 uVar12;
  undefined6 in_stack_ffffffffffffff22;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff30;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_ffffffffffffff38;
  double dVar13;
  Real in_stack_ffffffffffffff50;
  int nprocs_00;
  element_type *wgts;
  int local_74;
  double *local_58;
  double local_50;
  byte local_15;
  undefined1 sort;
  
  local_15 = 0;
  wgts = in_RDI;
  DistributionMapping((DistributionMapping *)0xf5a528);
  this = (DistributionMapping *)
         Vector<double,_std::allocator<double>_>::size
                   ((Vector<double,_std::allocator<double>_> *)0xf5a535);
  std::allocator<long>::allocator((allocator<long> *)0xf5a54c);
  Vector<long,_std::allocator<long>_>::vector
            ((Vector<long,_std::allocator<long>_> *)
             CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20),
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (allocator_type *)0xf5a563);
  std::allocator<long>::~allocator((allocator<long> *)0xf5a572);
  std::vector<double,_std::allocator<double>_>::begin
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::vector<double,_std::allocator<double>_>::end
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  efficiency = std::
               max_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                         (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  this_00 = (literals *)&local_58;
  local_58 = efficiency._M_current;
  pdVar1 = __gnu_cxx::
           __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
           operator*((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                      *)this_00);
  local_50 = *pdVar1;
  if ((local_50 != 0.0) || (NAN(local_50))) {
    lVar7 = (longdouble)1e+09;
    uVar10 = SUB104(lVar7,0);
    uVar11 = (undefined4)((unkuint10)lVar7 >> 0x20);
    uVar12 = (undefined2)((unkuint10)lVar7 >> 0x40);
    RVar8 = literals::operator____rt(this_00,lVar7);
    RVar8 = RVar8 / local_50;
  }
  else {
    lVar7 = (longdouble)1e+09;
    uVar10 = SUB104(lVar7,0);
    uVar11 = (undefined4)((unkuint10)lVar7 >> 0x20);
    uVar12 = (undefined2)((unkuint10)lVar7 >> 0x40);
    RVar8 = literals::operator____rt(this_00,lVar7);
    in_stack_ffffffffffffff50 = RVar8;
  }
  local_74 = 0;
  dVar13 = RVar8;
  while( true ) {
    lVar2 = (long)local_74;
    LVar3 = Vector<double,_std::allocator<double>_>::size
                      ((Vector<double,_std::allocator<double>_> *)0xf5a671);
    sort = (undefined1)((ulong)dVar13 >> 0x38);
    nprocs_00 = (int)((ulong)in_RDI >> 0x20);
    if (LVar3 <= lVar2) break;
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT62(in_stack_ffffffffffffff22,uVar12),CONCAT44(uVar11,uVar10));
    lVar2 = (long)(*pdVar4 * RVar8) + 1;
    plVar5 = Vector<long,_std::allocator<long>_>::operator[]
                       ((Vector<long,_std::allocator<long>_> *)
                        CONCAT62(in_stack_ffffffffffffff22,uVar12),CONCAT44(uVar11,uVar10));
    *plVar5 = lVar2;
    local_74 = local_74 + 1;
  }
  ParallelContext::NProcsSub();
  KnapSackProcessorMap
            (this,(vector<long,_std::allocator<long>_> *)wgts,nprocs_00,efficiency._M_current,
             SUB81((ulong)in_stack_ffffffffffffff50 >> 0x38,0),SUB84(in_stack_ffffffffffffff50,0),
             (bool)sort);
  local_15 = 1;
  Vector<long,_std::allocator<long>_>::~Vector((Vector<long,_std::allocator<long>_> *)0xf5a76e);
  _Var6._M_pi = extraout_RDX;
  if ((local_15 & 1) == 0) {
    ~DistributionMapping((DistributionMapping *)0xf5a782);
    _Var6._M_pi = extraout_RDX_00;
  }
  DVar9.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  DVar9.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = wgts;
  return (DistributionMapping)
         DVar9.m_ref.super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

DistributionMapping
DistributionMapping::makeKnapSack (const Vector<Real>& rcost, int nmax)
{
    BL_PROFILE("makeKnapSack");

    DistributionMapping r;

    Vector<Long> cost(rcost.size());

    Real wmax = *std::max_element(rcost.begin(), rcost.end());
    Real scale = (wmax == 0) ? 1.e9_rt : 1.e9_rt/wmax;

    for (int i = 0; i < rcost.size(); ++i) {
        cost[i] = Long(rcost[i]*scale) + 1L;
    }

    int nprocs = ParallelContext::NProcsSub();
    Real eff;

    r.KnapSackProcessorMap(cost, nprocs, &eff, true, nmax);

    return r;
}